

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
          (SourceLocationCommentPrinter *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->prefix_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->prefix_).field_2) {
    operator_delete(pcVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->source_loc_).leading_detached_comments);
  pcVar1 = (this->source_loc_).trailing_comments._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->source_loc_).trailing_comments.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->source_loc_).leading_comments._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->source_loc_).leading_comments.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

SourceLocationCommentPrinter(const DescType* desc, const std::string& prefix,
                               const DebugStringOptions& options)
      : options_(options), prefix_(prefix) {
    // Perform the SourceLocation lookup only if we're including user comments,
    // because the lookup is fairly expensive.
    have_source_loc_ =
        options.include_comments && desc->GetSourceLocation(&source_loc_);
  }